

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSpeedup.c
# Opt level: O0

void Abc_NtkDelayTracePrint(Abc_Ntk_t *pNtk,int fUseLutLib,int fVerbose)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  void *__s;
  Abc_Obj_t *pObj;
  char *pcVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  uint local_70;
  int local_5c;
  void *local_50;
  float Num;
  float nSteps;
  float tDelta;
  float tArrival;
  int *pCounters;
  int Nodes;
  int i;
  If_LibLut_t *pLutLib;
  Abc_Obj_t *pNode;
  int fVerbose_local;
  int fUseLutLib_local;
  Abc_Ntk_t *pNtk_local;
  
  if (fUseLutLib == 0) {
    local_50 = (void *)0x0;
  }
  else {
    local_50 = Abc_FrameReadLibLut();
  }
  if ((local_50 == (void *)0x0) ||
     (iVar4 = *(int *)((long)local_50 + 8), iVar2 = Abc_NtkGetFaninMax(pNtk), iVar2 <= iVar4)) {
    if (fUseLutLib == 0) {
      local_5c = Abc_NtkLevel(pNtk);
    }
    else {
      local_5c = 0x14;
    }
    fVar7 = (float)local_5c;
    uVar6 = (ulong)(fVar7 + 1.0);
    __s = malloc((uVar6 | (long)((fVar7 + 1.0) - 9.223372e+18) & (long)uVar6 >> 0x3f) << 2);
    fVar8 = (fVar7 + 1.0) * 4.0;
    uVar6 = (ulong)fVar8;
    memset(__s,0,uVar6 | (long)(fVar8 - 9.223372e+18) & (long)uVar6 >> 0x3f);
    fVar8 = Abc_NtkDelayTraceLut(pNtk,fUseLutLib);
    for (pCounters._4_4_ = 0; iVar4 = Vec_PtrSize(pNtk->vObjs), pCounters._4_4_ < iVar4;
        pCounters._4_4_ = pCounters._4_4_ + 1) {
      pObj = Abc_NtkObj(pNtk,pCounters._4_4_);
      if (((pObj != (Abc_Obj_t *)0x0) && (iVar4 = Abc_ObjIsNode(pObj), iVar4 != 0)) &&
         (iVar4 = Abc_ObjFaninNum(pObj), iVar4 != 0)) {
        fVar9 = Abc_ObjSlack(pObj);
        fVar9 = fVar9 / (fVar8 / fVar7);
        if ((fVar9 < 0.0) || (fVar7 < fVar9)) {
          __assert_fail("Num >=0 && Num <= nSteps",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcSpeedup.c"
                        ,0x10f,"void Abc_NtkDelayTracePrint(Abc_Ntk_t *, int, int)");
        }
        *(int *)((long)__s + (long)(int)fVar9 * 4) = *(int *)((long)__s + (long)(int)fVar9 * 4) + 1;
      }
    }
    pcVar5 = "unit-delay";
    if (fUseLutLib != 0) {
      pcVar5 = "LUT library";
    }
    printf("Max delay = %6.2f. Delay trace using %s model:\n",(double)fVar8,pcVar5);
    pCounters._0_4_ = 0;
    for (pCounters._4_4_ = 0; (float)pCounters._4_4_ < fVar7; pCounters._4_4_ = pCounters._4_4_ + 1)
    {
      pCounters._0_4_ = *(int *)((long)__s + (long)pCounters._4_4_ * 4) + (uint)pCounters;
      if (fUseLutLib == 0) {
        local_70 = pCounters._4_4_ + 1;
      }
      else {
        local_70 = (pCounters._4_4_ + 1) * 5;
      }
      pcVar5 = "lev";
      if (fUseLutLib != 0) {
        pcVar5 = "%";
      }
      iVar4 = Abc_NtkNodeNum(pNtk);
      printf("%3d %s : %5d  (%6.2f %%)\n",((double)(int)(uint)pCounters * 100.0) / (double)iVar4,
             (ulong)local_70,pcVar5,(ulong)(uint)pCounters);
    }
    if (__s != (void *)0x0) {
      free(__s);
    }
  }
  else {
    uVar1 = *(uint *)((long)local_50 + 8);
    uVar3 = Abc_NtkGetFaninMax(pNtk);
    printf("The max LUT size (%d) is less than the max fanin count (%d).\n",(ulong)uVar1,
           (ulong)uVar3);
  }
  return;
}

Assistant:

void Abc_NtkDelayTracePrint( Abc_Ntk_t * pNtk, int fUseLutLib, int fVerbose )
{
    Abc_Obj_t * pNode;
    If_LibLut_t * pLutLib;
    int i, Nodes, * pCounters;
    float tArrival, tDelta, nSteps, Num;
    // get the library
    pLutLib = fUseLutLib?  (If_LibLut_t *)Abc_FrameReadLibLut() : NULL;
    if ( pLutLib && pLutLib->LutMax < Abc_NtkGetFaninMax(pNtk) )
    {
        printf( "The max LUT size (%d) is less than the max fanin count (%d).\n", 
            pLutLib->LutMax, Abc_NtkGetFaninMax(pNtk) );
        return;
    }
    // decide how many steps
    nSteps = fUseLutLib ? 20 : Abc_NtkLevel(pNtk);
    pCounters = ABC_ALLOC( int, nSteps + 1 );
    memset( pCounters, 0, sizeof(int)*(nSteps + 1) );
    // perform delay trace
    tArrival = Abc_NtkDelayTraceLut( pNtk, fUseLutLib );
    tDelta = tArrival / nSteps;
    // count how many nodes have slack in the corresponding intervals
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_ObjFaninNum(pNode) == 0 )
            continue;
        Num = Abc_ObjSlack(pNode) / tDelta;
        assert( Num >=0 && Num <= nSteps );
        pCounters[(int)Num]++;
    }
    // print the results
    printf( "Max delay = %6.2f. Delay trace using %s model:\n", tArrival, fUseLutLib? "LUT library" : "unit-delay" );
    Nodes = 0;
    for ( i = 0; i < nSteps; i++ )
    {
        Nodes += pCounters[i];
        printf( "%3d %s : %5d  (%6.2f %%)\n", fUseLutLib? 5*(i+1) : i+1, 
            fUseLutLib? "%":"lev", Nodes, 100.0*Nodes/Abc_NtkNodeNum(pNtk) );
    }
    ABC_FREE( pCounters );
}